

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QAdoptedThread::QAdoptedThread(QAdoptedThread *this,QThreadData *data)

{
  AtomicType AVar1;
  QObjectPrivate *this_00;
  QObjectData *pQVar2;
  QThreadPrivate *this_01;
  QBindingStatus *status;
  QThreadPrivate *pQVar3;
  long in_FS_OFFSET;
  Data *local_20;
  
  pQVar3 = (QThreadPrivate *)&stack0xffffffffffffffc8;
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  this_01 = (QThreadPrivate *)operator_new(0xd0);
  QThreadPrivate::QThreadPrivate(this_01,data);
  QThread::QThread(&this->super_QThread,this_01,(QObject *)0x0);
  (this->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_00666e28;
  QThreadData::deref(data);
  data->isAdopted = true;
  AVar1._M_b._M_p = (__base_type)((__base_type *)(in_FS_OFFSET + 0x10))->_M_p;
  (data->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p =
       (__pointer_type)AVar1._M_b._M_p;
  if (QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p == (__base_type)0x0) {
    this_00 = (QObjectPrivate *)(this->super_QThread).super_QObject.d_ptr.d;
    QCoreApplicationPrivate::theMainThread._q_value._M_b._M_p = (AtomicType)(AtomicType)this;
    QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p =
         (AtomicType)(AtomicType)AVar1._M_b._M_p;
    Qt::Literals::StringLiterals::operator____s
              ((QString *)&stack0xffffffffffffffc8,L"Qt mainThread",0xd);
    QObjectPrivate::setObjectNameWithoutBindings(this_00,(QString *)&stack0xffffffffffffffc8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc8);
    this_01 = pQVar3;
  }
  *(undefined1 *)
   &(this->super_QThread).super_QObject.d_ptr.d[1].postedEvents.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 1;
  init(this,(EVP_PKEY_CTX *)this_01);
  pQVar2 = (this->super_QThread).super_QObject.d_ptr.d;
  status = QtPrivate::getBindingStatus();
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)&pQVar2[2].parent,status);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAdoptedThread::QAdoptedThread(QThreadData *data)
    : QThread(*new QThreadPrivate(data))
{
    // avoid a cyclic reference count: QThreadData owns this QAdoptedThread
    // object but QObject's constructor increased the count
    data->deref();

    data->isAdopted = true;
    Qt::HANDLE id = QThread::currentThreadId();
    data->threadId.storeRelaxed(id);
    if (!QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        // we are the main thread
        QCoreApplicationPrivate::theMainThread.storeRelease(this);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(id);

        // bypass the bindings because nothing can be listening yet
        d_func()->setObjectNameWithoutBindings(u"Qt mainThread"_s);
    }

    // thread should be running and not finished for the lifetime
    // of the application (even if QCoreApplication goes away)
#if QT_CONFIG(thread)
    d_func()->threadState = QThreadPrivate::Running;
    init();
    d_func()->m_statusOrPendingObjects.setStatusAndClearList(
                QtPrivate::getBindingStatus({}));
#endif
    // fprintf(stderr, "new QAdoptedThread = %p\n", this);
}